

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O1

int genaInitNotify(UpnpDevice_Handle device_handle,char *UDN,char *servId,char **VarNames,
                  char **VarValues,int var_count,char *sid)

{
  char *propertySet;
  uint uVar1;
  int DbgLineNo;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  uVar1 = 0;
  local_38 = servId;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2a2,"GENA BEGIN INITIAL NOTIFY\n");
  if (var_count < 1) {
    DbgLineNo = 0x2a6;
  }
  else {
    uVar1 = GeneratePropertySet(VarNames,VarValues,var_count,&local_40);
    propertySet = local_40;
    if (uVar1 == 0) {
      DbgLineNo = 0;
      UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2b3,
                 "GENERATED PROPERTY SET IN INIT NOTIFY: %s\n",local_40);
      uVar1 = genaInitNotifyCommon(device_handle,UDN,local_38,propertySet,sid);
    }
    else {
      DbgLineNo = 0x2ad;
    }
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END INITIAL NOTIFY, ret = %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int genaInitNotify(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	char **VarNames,
	char **VarValues,
	int var_count,
	const Upnp_SID sid)
{
	int ret = GENA_SUCCESS;
	int line = 0;
	DOMString propertySet = NULL;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN INITIAL NOTIFY\n");

	if (var_count <= 0) {
		line = __LINE__;
		ret = GENA_SUCCESS;
		goto ExitFunction;
	}

	ret = GeneratePropertySet(VarNames, VarValues, var_count, &propertySet);
	if (ret != XML_SUCCESS) {
		line = __LINE__;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN INIT NOTIFY: %s\n",
		propertySet);

	ret = genaInitNotifyCommon(
		device_handle, UDN, servId, propertySet, sid);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END INITIAL NOTIFY, ret = %d\n",
		ret);

	return ret;
}